

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
               (date_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  VectorType VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  data_ptr_t pdVar3;
  int64_t *piVar4;
  unsigned_long *puVar5;
  long *plVar6;
  ulong *puVar7;
  timestamp_t *ptVar8;
  byte bVar9;
  SelectionVector *pSVar10;
  data_ptr_t pdVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  bool bVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  VectorBuffer *pVVar17;
  idx_t iVar18;
  idx_t count_00;
  idx_t idx_in_entry;
  ulong uVar19;
  Vector *vector;
  undefined1 adds_nulls_00;
  ValidityMask *pVVar20;
  char cVar21;
  ValidityMask *pVVar22;
  buffer_ptr<ValidityBuffer> *this;
  sel_t *psVar23;
  UnifiedVectorFormat UStack_e0;
  idx_t iStack_90;
  ValidityMask *pVStack_88;
  date_t *pdStack_80;
  buffer_ptr<ValidityBuffer> *pbStack_78;
  idx_t iStack_70;
  sel_t *psStack_68;
  code *pcStack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined1 local_48 [16];
  element_type *local_38;
  
  local_38 = (element_type *)result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar23 = sel_vector->sel_vector;
      this = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      uVar19 = 0;
      pVVar20 = result_mask;
      do {
        uVar15 = uVar19;
        if (psVar23 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar23[uVar19];
        }
        vector = (Vector *)(ulong)(uint)ldata[uVar15].days;
        pcStack_60 = (code *)0xf72b4d;
        bVar14 = Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar15].days);
        adds_nulls_00 = SUB81(mask,0);
        cVar21 = (char)pVVar20;
        if (bVar14) goto LAB_00f72bed;
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_48._0_8_ = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)local_48;
          pcStack_60 = (code *)0xf72b71;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var13 = p_Stack_50;
          peVar12 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72b8e;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72b9d;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pcStack_60 = (code *)0xf72ba5;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(this)
          ;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar19 & 0x3f;
        sel_vector = (SelectionVector *)
                     (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        (&sel_vector->sel_vector)[uVar19 >> 6] =
             (sel_t *)((ulong)(&sel_vector->sel_vector)[uVar19 >> 6] &
                      (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9));
        (&local_38->_vptr_ExtraTypeInfo)[uVar19] = (_func_int **)0x0;
        uVar19 = uVar19 + 1;
      } while (count != uVar19);
    }
  }
  else if (count != 0) {
    psVar23 = sel_vector->sel_vector;
    local_48._8_8_ = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar19 = 0;
    pVVar20 = mask;
    pVVar22 = result_mask;
    do {
      uVar15 = uVar19;
      if (psVar23 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar23[uVar19];
      }
      sel_vector = (SelectionVector *)
                   (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar15 >> 6];
      if (((ulong)sel_vector >> (uVar15 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_48._0_8_ = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)local_48;
          pcStack_60 = (code *)0xf72abf;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var13 = p_Stack_50;
          peVar12 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72adc;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72aeb;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pcStack_60 = (code *)0xf72af5;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_48._8_8_);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar19 & 0x3f;
        puVar7 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar19 >> 6);
        *puVar7 = *puVar7 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      else {
        vector = (Vector *)(ulong)(uint)ldata[uVar15].days;
        pcStack_60 = (code *)0xf72a1a;
        bVar14 = Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar15].days);
        adds_nulls_00 = SUB81(pVVar20,0);
        cVar21 = (char)pVVar22;
        this = (buffer_ptr<ValidityBuffer> *)mask;
        if (bVar14) goto LAB_00f72bed;
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_48._0_8_ = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          result_data = (long *)local_48;
          pcStack_60 = (code *)0xf72a3e;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)result_data);
          p_Var13 = p_Stack_50;
          peVar12 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72a5b;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_60 = (code *)0xf72a6a;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pcStack_60 = (code *)0xf72a74;
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_48._8_8_);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar19 & 0x3f;
        puVar7 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar19 >> 6);
        *puVar7 = *puVar7 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        (&local_38->_vptr_ExtraTypeInfo)[uVar19] = (_func_int **)0x0;
      }
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return;
LAB_00f72bed:
  pcStack_60 = 
  ExecuteStandard<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
  ;
  DatePart::TimezoneOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)vector);
  VVar1 = vector->vector_type;
  pVStack_88 = result_mask;
  pdStack_80 = ldata;
  pbStack_78 = this;
  iStack_70 = count;
  psStack_68 = psVar23;
  pcStack_60 = (code *)uVar19;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType((Vector *)result_data,FLAT_VECTOR);
    plVar6 = (long *)((Vector *)result_data)->data;
    ptVar8 = (timestamp_t *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector((Vector *)result_data);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
              (ptVar8,plVar6,count_00,&vector->validity,&((Vector *)result_data)->validity,
               sel_vector,(bool)adds_nulls_00);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType((Vector *)result_data,CONSTANT_VECTOR);
      pdVar3 = ((Vector *)result_data)->data;
      piVar4 = (int64_t *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull((Vector *)result_data,true);
        return;
      }
      ConstantVector::SetNull((Vector *)result_data,false);
      bVar14 = Value::IsFinite<duckdb::timestamp_t>((timestamp_t)*piVar4);
      if (!bVar14) {
        if ((((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
            validity_mask == (unsigned_long *)0x0) {
          iStack_90 = (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>
                      .capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&UStack_e0,&iStack_90);
          pdVar11 = UStack_e0.data;
          pSVar10 = UStack_e0.sel;
          UStack_e0.sel = (SelectionVector *)0x0;
          UStack_e0.data = (data_ptr_t)0x0;
          p_Var2 = (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
                   validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
          validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar10;
          (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
          validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UStack_e0.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UStack_e0.data);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(((Vector *)result_data)->validity).
                                super_TemplatedValidityMask<unsigned_long>.validity_data);
          (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
          validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        puVar7 = (((Vector *)result_data)->validity).super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        *puVar7 = *puVar7 & 0xfffffffffffffffe;
      }
      pdVar3[0] = '\0';
      pdVar3[1] = '\0';
      pdVar3[2] = '\0';
      pdVar3[3] = '\0';
      pdVar3[4] = '\0';
      pdVar3[5] = '\0';
      pdVar3[6] = '\0';
      pdVar3[7] = '\0';
      return;
    }
    goto LAB_00f72c7b;
  }
  if (cVar21 != '\0') goto LAB_00f72c7b;
  DictionaryVector::VerifyDictionary(vector);
  pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  UStack_e0.sel = (SelectionVector *)pVVar17[1].data.allocator.ptr;
  if (((Allocator *)UStack_e0.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar18 = optional_idx::GetIndex((optional_idx *)&UStack_e0), count_00 < iVar18 * 2)) {
LAB_00f72f14:
    bVar14 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(vector);
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    bVar14 = *(char *)&pVVar17[1]._vptr_VectorBuffer == '\0';
    if (!bVar14) goto LAB_00f72f14;
    plVar6 = (long *)((Vector *)result_data)->data;
    ptVar8 = (timestamp_t *)pVVar17[1].data.pointer;
    iVar18 = optional_idx::GetIndex((optional_idx *)&UStack_e0);
    FlatVector::VerifyFlatVector((Vector *)(pVVar17 + 1));
    FlatVector::VerifyFlatVector((Vector *)result_data);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
              (ptVar8,plVar6,iVar18,(ValidityMask *)&pVVar17[1].data.allocated_size,
               &((Vector *)result_data)->validity,sel_vector,(bool)adds_nulls_00);
    DictionaryVector::VerifyDictionary(vector);
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
    iVar18 = optional_idx::GetIndex((optional_idx *)&UStack_e0);
    Vector::Dictionary((Vector *)result_data,(Vector *)result_data,iVar18,
                       (SelectionVector *)(pVVar17 + 1),count_00);
  }
  if (bVar14) {
    return;
  }
LAB_00f72c7b:
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_e0);
  Vector::ToUnifiedFormat(vector,count_00,&UStack_e0);
  Vector::SetVectorType((Vector *)result_data,FLAT_VECTOR);
  pSVar10 = UStack_e0.sel;
  plVar6 = (long *)((Vector *)result_data)->data;
  FlatVector::VerifyFlatVector((Vector *)result_data);
  ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneOperator>>
            ((timestamp_t *)UStack_e0.data,plVar6,count_00,pSVar10,&UStack_e0.validity,
             &((Vector *)result_data)->validity,sel_vector,(bool)adds_nulls_00);
  if (UStack_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (UStack_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}